

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLMaterialLoader.cpp
# Opt level: O3

aiColor4D __thiscall
Assimp::MDLImporter::ReplaceTextureWithColor(MDLImporter *this,aiTexture *pcTexture)

{
  uchar *puVar1;
  ushort uVar2;
  aiTexel *paVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  aiColor4D aVar11;
  
  if (pcTexture == (aiTexture *)0x0) {
    __assert_fail("__null != pcTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
                  ,0x67,"aiColor4D Assimp::MDLImporter::ReplaceTextureWithColor(const aiTexture *)")
    ;
  }
  uVar6 = 0x7fc00000;
  uVar8 = 0;
  if ((pcTexture->mHeight != 0) && (pcTexture->mWidth != 0)) {
    paVar3 = pcTexture->pcData;
    lVar5 = 4;
    while ((ulong)(pcTexture->mWidth * pcTexture->mHeight) << 2 != lVar5) {
      if (((((&paVar3->b)[lVar5] != (&paVar3[-1].b)[lVar5]) ||
           ((&paVar3->r)[lVar5] != *(uchar *)((long)paVar3 + lVar5 + -2))) ||
          ((&paVar3->g)[lVar5] != *(uchar *)((long)paVar3 + lVar5 + -3))) ||
         (puVar1 = &paVar3->a + lVar5, lVar4 = lVar5 + -1, lVar5 = lVar5 + 4,
         *puVar1 != *(uchar *)((long)paVar3 + lVar4))) goto LAB_0043c7ef;
    }
    uVar2._0_1_ = paVar3->g;
    uVar2._1_1_ = paVar3->r;
    auVar7._4_4_ = (float)(uVar2 & 0xff);
    auVar7._0_4_ = (float)(byte)uVar2._1_1_;
    auVar7._8_8_ = 0;
    auVar9._0_4_ = (float)paVar3->b;
    auVar9._4_4_ = (float)paVar3->a;
    auVar9._8_8_ = 0;
    auVar10 = divps(auVar9,_DAT_0075e730);
    uVar8 = auVar10._0_8_;
    auVar10._4_4_ = (int)DAT_0075e730;
    auVar10._0_4_ = DAT_0075e730._4_4_;
    auVar10._8_4_ = DAT_0075e730._8_4_;
    auVar10._12_4_ = DAT_0075e730._12_4_;
    auVar10 = divps(auVar7,auVar10);
    uVar6 = auVar10._0_8_;
  }
LAB_0043c7ef:
  aVar11.b = (float)(int)uVar8;
  aVar11.a = (float)(int)((ulong)uVar8 >> 0x20);
  aVar11.r = (float)(int)uVar6;
  aVar11.g = (float)(int)((ulong)uVar6 >> 0x20);
  return aVar11;
}

Assistant:

aiColor4D MDLImporter::ReplaceTextureWithColor(const aiTexture* pcTexture)
{
    ai_assert(NULL != pcTexture);

    aiColor4D clrOut;
    clrOut.r = get_qnan();
    if (!pcTexture->mHeight || !pcTexture->mWidth)
        return clrOut;

    const unsigned int iNumPixels = pcTexture->mHeight*pcTexture->mWidth;
    const aiTexel* pcTexel = pcTexture->pcData+1;
    const aiTexel* const pcTexelEnd = &pcTexture->pcData[iNumPixels];

    while (pcTexel != pcTexelEnd)
    {
        if (*pcTexel != *(pcTexel-1))
        {
            pcTexel = NULL;
            break;
        }
        ++pcTexel;
    }
    if (pcTexel)
    {
        clrOut.r = pcTexture->pcData->r / 255.0f;
        clrOut.g = pcTexture->pcData->g / 255.0f;
        clrOut.b = pcTexture->pcData->b / 255.0f;
        clrOut.a = pcTexture->pcData->a / 255.0f;
    }
    return clrOut;
}